

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O2

bool IsWitnessStandard(CTransaction *tx,CCoinsViewCache *mapInputs)

{
  long *plVar1;
  long lVar2;
  pointer pCVar3;
  pointer pvVar4;
  byte *pbVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  Coin *pCVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long in_FS_OFFSET;
  int witnessversion;
  pointer pvStack_90;
  pointer local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  CScript prevScript;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = CTransaction::IsCoinBase(tx);
  bVar8 = true;
  if (!bVar7) {
    uVar14 = 0;
    while( true ) {
      uVar10 = (ulong)uVar14;
      pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar3) / 0x68) <= uVar10) break;
      if (*(pointer *)&pCVar3[uVar10].scriptWitness.stack !=
          *(pointer *)((long)&pCVar3[uVar10].scriptWitness.stack + 8)) {
        pCVar9 = CCoinsViewCache::AccessCoin(mapInputs,&pCVar3[uVar10].prevout);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  (&prevScript.super_CScriptBase,&(pCVar9->out).scriptPubKey.super_CScriptBase);
        bVar7 = CScript::IsPayToAnchor((CScript *)&prevScript.super_CScriptBase);
        if (bVar7) {
LAB_0059f66d:
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    (&prevScript.super_CScriptBase);
          bVar8 = false;
          goto LAB_0059f67d;
        }
        bVar7 = CScript::IsPayToScriptHash((CScript *)&prevScript.super_CScriptBase);
        if (bVar7) {
          local_88 = (pointer)0x0;
          _witnessversion = (pointer)0x0;
          pvStack_90 = (pointer)0x0;
          witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR_CheckECDSASignature_00a297f0;
          bVar8 = EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&witnessversion,
                             &(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar10].scriptSig,0,
                             (BaseSignatureChecker *)&witnessprogram,BASE,(ScriptError *)0x0);
          if ((!bVar8) || (_witnessversion == pvStack_90)) {
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)&witnessversion);
            goto LAB_0059f66d;
          }
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&witnessprogram,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )pvStack_90[-1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )pvStack_90[-1].
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&prevScript.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&witnessprogram);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&witnessprogram);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&witnessversion);
        }
        _witnessversion = (pointer)((ulong)_witnessversion & 0xffffffff00000000);
        witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar8 = CScript::IsWitnessProgram
                          ((CScript *)&prevScript.super_CScriptBase,&witnessversion,&witnessprogram)
        ;
        if (!bVar8) goto LAB_0059f663;
        if (witnessversion == 1) {
          if (!bVar7 && (long)witnessprogram.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)witnessprogram.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start == 0x20) {
            pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start;
            plVar11 = *(long **)&pCVar3[uVar10].scriptWitness.stack;
            lVar12 = (long)*(pointer *)((long)&pCVar3[uVar10].scriptWitness.stack + 8) -
                     (long)plVar11;
            if ((ulong)(lVar12 / 0x18) < 2) {
              if (lVar12 != 0x18) goto LAB_0059f663;
            }
            else {
              pbVar5 = *(byte **)((long)plVar11 + lVar12 + -0x18);
              if ((pbVar5 == *(byte **)((long)plVar11 + lVar12 + -0x10)) || (*pbVar5 == 0x50))
              goto LAB_0059f663;
              if ((*pbVar5 & 0xfe) == 0xc0) {
                lVar12 = lVar12 + -0x30;
                while (lVar12 != 0) {
                  plVar1 = plVar11 + 1;
                  lVar6 = *plVar11;
                  plVar11 = plVar11 + 3;
                  lVar12 = lVar12 + -0x18;
                  if (0x50 < (ulong)(*plVar1 - lVar6)) goto LAB_0059f663;
                }
              }
            }
          }
        }
        else if ((witnessversion == 0) &&
                ((long)witnessprogram.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)witnessprogram.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start == 0x20)) {
          pCVar3 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar4 = *(pointer *)((long)&pCVar3[uVar10].scriptWitness.stack + 8);
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar4[-1].
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl + 8) -
                     *(long *)&pvVar4[-1].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl) < 0xe11) {
            lVar12 = *(long *)&pCVar3[uVar10].scriptWitness.stack.
                               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ;
            uVar10 = ((long)pvVar4 - lVar12) / 0x18 - 1;
            if (uVar10 < 0x65) {
              plVar11 = (long *)(lVar12 + 8);
              uVar13 = 0xffffffff;
              while (uVar13 = uVar13 + 1, uVar13 < (uint)uVar10) {
                lVar12 = *plVar11;
                plVar1 = plVar11 + -1;
                plVar11 = plVar11 + 3;
                if (0x50 < (ulong)(lVar12 - *plVar1)) goto LAB_0059f663;
              }
              goto LAB_0059f647;
            }
          }
LAB_0059f663:
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&witnessprogram.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          goto LAB_0059f66d;
        }
LAB_0059f647:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&witnessprogram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  );
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&prevScript.super_CScriptBase);
      }
      uVar14 = uVar14 + 1;
    }
    bVar8 = true;
  }
LAB_0059f67d:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool IsWitnessStandard(const CTransaction& tx, const CCoinsViewCache& mapInputs)
{
    if (tx.IsCoinBase())
        return true; // Coinbases are skipped

    for (unsigned int i = 0; i < tx.vin.size(); i++)
    {
        // We don't care if witness for this input is empty, since it must not be bloated.
        // If the script is invalid without witness, it would be caught sooner or later during validation.
        if (tx.vin[i].scriptWitness.IsNull())
            continue;

        const CTxOut &prev = mapInputs.AccessCoin(tx.vin[i].prevout).out;

        // get the scriptPubKey corresponding to this input:
        CScript prevScript = prev.scriptPubKey;

        // witness stuffing detected
        if (prevScript.IsPayToAnchor()) {
            return false;
        }

        bool p2sh = false;
        if (prevScript.IsPayToScriptHash()) {
            std::vector <std::vector<unsigned char> > stack;
            // If the scriptPubKey is P2SH, we try to extract the redeemScript casually by converting the scriptSig
            // into a stack. We do not check IsPushOnly nor compare the hash as these will be done later anyway.
            // If the check fails at this stage, we know that this txid must be a bad one.
            if (!EvalScript(stack, tx.vin[i].scriptSig, SCRIPT_VERIFY_NONE, BaseSignatureChecker(), SigVersion::BASE))
                return false;
            if (stack.empty())
                return false;
            prevScript = CScript(stack.back().begin(), stack.back().end());
            p2sh = true;
        }

        int witnessversion = 0;
        std::vector<unsigned char> witnessprogram;

        // Non-witness program must not be associated with any witness
        if (!prevScript.IsWitnessProgram(witnessversion, witnessprogram))
            return false;

        // Check P2WSH standard limits
        if (witnessversion == 0 && witnessprogram.size() == WITNESS_V0_SCRIPTHASH_SIZE) {
            if (tx.vin[i].scriptWitness.stack.back().size() > MAX_STANDARD_P2WSH_SCRIPT_SIZE)
                return false;
            size_t sizeWitnessStack = tx.vin[i].scriptWitness.stack.size() - 1;
            if (sizeWitnessStack > MAX_STANDARD_P2WSH_STACK_ITEMS)
                return false;
            for (unsigned int j = 0; j < sizeWitnessStack; j++) {
                if (tx.vin[i].scriptWitness.stack[j].size() > MAX_STANDARD_P2WSH_STACK_ITEM_SIZE)
                    return false;
            }
        }

        // Check policy limits for Taproot spends:
        // - MAX_STANDARD_TAPSCRIPT_STACK_ITEM_SIZE limit for stack item size
        // - No annexes
        if (witnessversion == 1 && witnessprogram.size() == WITNESS_V1_TAPROOT_SIZE && !p2sh) {
            // Taproot spend (non-P2SH-wrapped, version 1, witness program size 32; see BIP 341)
            Span stack{tx.vin[i].scriptWitness.stack};
            if (stack.size() >= 2 && !stack.back().empty() && stack.back()[0] == ANNEX_TAG) {
                // Annexes are nonstandard as long as no semantics are defined for them.
                return false;
            }
            if (stack.size() >= 2) {
                // Script path spend (2 or more stack elements after removing optional annex)
                const auto& control_block = SpanPopBack(stack);
                SpanPopBack(stack); // Ignore script
                if (control_block.empty()) return false; // Empty control block is invalid
                if ((control_block[0] & TAPROOT_LEAF_MASK) == TAPROOT_LEAF_TAPSCRIPT) {
                    // Leaf version 0xc0 (aka Tapscript, see BIP 342)
                    for (const auto& item : stack) {
                        if (item.size() > MAX_STANDARD_TAPSCRIPT_STACK_ITEM_SIZE) return false;
                    }
                }
            } else if (stack.size() == 1) {
                // Key path spend (1 stack element after removing optional annex)
                // (no policy rules apply)
            } else {
                // 0 stack elements; this is already invalid by consensus rules
                return false;
            }
        }
    }
    return true;
}